

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::DOMNodeImpl::getTextContent(DOMNodeImpl *this)

{
  int iVar1;
  DOMDocument *pDVar2;
  undefined4 extraout_var;
  XMLSize_t nBufferLength;
  XMLSize_t local_20;
  XMLCh *pzBuffer;
  
  local_20 = 0;
  getTextContent(this,(XMLCh *)0x0,&local_20);
  pDVar2 = getOwnerDocument(this);
  iVar1 = (*pDVar2[-1].super_DOMNode._vptr_DOMNode[4])(&pDVar2[-1].super_DOMNode,local_20 * 2 + 2);
  pzBuffer = (XMLCh *)CONCAT44(extraout_var,iVar1);
  getTextContent(this,pzBuffer,&local_20);
  pzBuffer[local_20] = L'\0';
  return pzBuffer;
}

Assistant:

const XMLCh*     DOMNodeImpl::getTextContent() const
{
	XMLSize_t nBufferLength = 0;

	getTextContent(NULL, nBufferLength);
	XMLCh* pzBuffer = (XMLCh*)((DOMDocumentImpl*)getOwnerDocument())->allocate((nBufferLength+1) * sizeof(XMLCh));
	getTextContent(pzBuffer, nBufferLength);
	pzBuffer[nBufferLength] = 0;

	return pzBuffer;

}